

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.cpp
# Opt level: O0

ZSTD_parameters *
duckdb_zstd::ZSTD_getParams_internal
          (int compressionLevel,unsigned_long_long srcSizeHint,size_t dictSize,
          ZSTD_cParamMode_e mode)

{
  ZSTD_parameters *in_RDI;
  ZSTD_compressionParameters cParams;
  undefined4 in_stack_00000040;
  unsigned_long_long in_stack_00000048;
  int in_stack_00000054;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  ZSTD_strategy local_20;
  
  ZSTD_getCParams_internal
            (in_stack_00000054,in_stack_00000048,CONCAT44(compressionLevel,in_stack_00000040),
             srcSizeHint._4_4_);
  memset(in_RDI,0,0x28);
  (in_RDI->cParams).windowLog = (undefined4)local_38;
  (in_RDI->cParams).chainLog = local_38._4_4_;
  (in_RDI->cParams).hashLog = (undefined4)local_30;
  (in_RDI->cParams).searchLog = local_30._4_4_;
  (in_RDI->cParams).minMatch = (undefined4)local_28;
  (in_RDI->cParams).targetLength = local_28._4_4_;
  (in_RDI->cParams).strategy = local_20;
  (in_RDI->fParams).contentSizeFlag = 1;
  return in_RDI;
}

Assistant:

static ZSTD_parameters ZSTD_getParams_internal(int compressionLevel, unsigned long long srcSizeHint, size_t dictSize, ZSTD_cParamMode_e mode) {
    ZSTD_parameters params;
    ZSTD_compressionParameters const cParams = ZSTD_getCParams_internal(compressionLevel, srcSizeHint, dictSize, mode);
    DEBUGLOG(5, "ZSTD_getParams (cLevel=%i)", compressionLevel);
    ZSTD_memset(&params, 0, sizeof(params));
    params.cParams = cParams;
    params.fParams.contentSizeFlag = 1;
    return params;
}